

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.cpp
# Opt level: O2

string * __thiscall Block::CalculateBlockHash_abi_cxx11_(string *__return_storage_ptr__,Block *this)

{
  ostream *poVar1;
  stringstream ss;
  string sStack_1b8;
  stringstream local_198 [16];
  undefined1 local_188 [376];
  
  std::__cxx11::stringstream::stringstream(local_198);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_188);
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  poVar1 = std::operator<<(poVar1,(string *)&this->_bData);
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  poVar1 = std::operator<<(poVar1,(string *)this);
  std::operator<<(poVar1,(string *)&this->merkle_root);
  std::__cxx11::stringbuf::str();
  sha256(__return_storage_ptr__,&sStack_1b8);
  std::__cxx11::string::~string((string *)&sStack_1b8);
  std::__cxx11::stringstream::~stringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

string Block::CalculateBlockHash()
{
	stringstream ss;
	ss<< _bIndex << _cTime << _bData << _bNonce << bPrevHash << merkle_root;
	return sha256(ss.str());

}